

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O3

void __thiscall
cfd::api::json::ElementsDecodeIssuance::ConvertFromStruct
          (ElementsDecodeIssuance *this,ElementsDecodeIssuanceStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->asset_blinding_nonce_);
  std::__cxx11::string::_M_assign((string *)&this->asset_entropy_);
  std::__cxx11::string::_M_assign((string *)&this->contract_hash_);
  this->isreissuance_ = data->isreissuance;
  std::__cxx11::string::_M_assign((string *)&this->token_);
  std::__cxx11::string::_M_assign((string *)&this->asset_);
  this->assetamount_ = data->assetamount;
  std::__cxx11::string::_M_assign((string *)&this->assetamountcommitment_);
  this->tokenamount_ = data->tokenamount;
  std::__cxx11::string::_M_assign((string *)&this->tokenamountcommitment_);
  std::__cxx11::string::_M_assign((string *)&this->asset_rangeproof_);
  std::__cxx11::string::_M_assign((string *)&this->token_rangeproof_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void ElementsDecodeIssuance::ConvertFromStruct(
    const ElementsDecodeIssuanceStruct& data) {
  asset_blinding_nonce_ = data.asset_blinding_nonce;
  asset_entropy_ = data.asset_entropy;
  contract_hash_ = data.contract_hash;
  isreissuance_ = data.isreissuance;
  token_ = data.token;
  asset_ = data.asset;
  assetamount_ = data.assetamount;
  assetamountcommitment_ = data.assetamountcommitment;
  tokenamount_ = data.tokenamount;
  tokenamountcommitment_ = data.tokenamountcommitment;
  asset_rangeproof_ = data.asset_rangeproof;
  token_rangeproof_ = data.token_rangeproof;
  ignore_items = data.ignore_items;
}